

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicPropsCmd.cpp
# Opt level: O0

int check_short_opt(int argc,char **argv,char *optstring,int print_errors,custom_getopt_data *d)

{
  int iVar1;
  char *pcVar2;
  int in_ECX;
  char *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  int *in_R8;
  char *temp;
  char c;
  char local_29;
  int local_4;
  
  pcVar2 = *(char **)(in_R8 + 8);
  *(char **)(in_R8 + 8) = pcVar2 + 1;
  local_29 = *pcVar2;
  pcVar2 = strchr(in_RDX,(int)local_29);
  if (**(char **)(in_R8 + 8) == '\0') {
    *in_R8 = *in_R8 + 1;
  }
  if ((pcVar2 == (char *)0x0) || (local_29 == ':')) {
    if (in_ECX != 0) {
      fprintf(_stderr,"%s: invalid option -- %c\n",*in_RSI,(ulong)(uint)(int)local_29);
    }
    in_R8[2] = (int)local_29;
    local_4 = 0x3f;
  }
  else {
    if (pcVar2[1] == ':') {
      if (pcVar2[2] == ':') {
        if (**(char **)(in_R8 + 8) == '\0') {
          in_R8[4] = 0;
          in_R8[5] = 0;
        }
        else {
          *(undefined8 *)(in_R8 + 4) = *(undefined8 *)(in_R8 + 8);
          *in_R8 = *in_R8 + 1;
        }
        in_R8[8] = 0;
        in_R8[9] = 0;
      }
      else {
        if (**(char **)(in_R8 + 8) == '\0') {
          if (*in_R8 == in_EDI) {
            if (in_ECX != 0) {
              fprintf(_stderr,"%s: option requires an argument -- %c\n",*in_RSI,
                      (ulong)(uint)(int)local_29);
            }
            in_R8[2] = (int)local_29;
            if (*in_RDX == ':') {
              local_29 = ':';
            }
            else {
              local_29 = '?';
            }
          }
          else {
            iVar1 = *in_R8;
            *in_R8 = iVar1 + 1;
            *(undefined8 *)(in_R8 + 4) = in_RSI[iVar1];
          }
        }
        else {
          *(undefined8 *)(in_R8 + 4) = *(undefined8 *)(in_R8 + 8);
          *in_R8 = *in_R8 + 1;
        }
        in_R8[8] = 0;
        in_R8[9] = 0;
      }
    }
    local_4 = (int)local_29;
  }
  return local_4;
}

Assistant:

static int check_short_opt(int argc, char *const *argv, const char *optstring,
		int print_errors, struct custom_getopt_data *d)
{
	char c = *d->nextchar++;
	const char *temp = strchr(optstring, c);

	/* Increment `custom_optind' when we start to process its last character.  */
	if (*d->nextchar == '\0')
		++d->custom_optind;
	if (!temp || c == ':') {
		if (print_errors)
			fprintf(stderr, "%s: invalid option -- %c\n", argv[0], c);

		d->custom_optopt = c;
		return '?';
	}
	if (temp[1] == ':') {
		if (temp[2] == ':') {
			/* This is an option that accepts an argument optionally.  */
			if (*d->nextchar != '\0') {
				d->custom_optarg = d->nextchar;
				d->custom_optind++;
			} else
				d->custom_optarg = NULL;
			d->nextchar = NULL;
		} else {
			/* This is an option that requires an argument.  */
			if (*d->nextchar != '\0') {
				d->custom_optarg = d->nextchar;
				/*
				 * If we end this ARGV-element by taking the
				 * rest as an arg, we must advance to the next
				 * element now.
				 */
				d->custom_optind++;
			} else if (d->custom_optind == argc) {
				if (print_errors) {
					fprintf(stderr,
						"%s: option requires an argument -- %c\n",
						argv[0], c);
				}
				d->custom_optopt = c;
				if (optstring[0] == ':')
					c = ':';
				else
					c = '?';
			} else
				/*
				 * We already incremented `custom_optind' once;
				 * increment it again when taking next ARGV-elt
				 * as argument.
				 */
				d->custom_optarg = argv[d->custom_optind++];
			d->nextchar = NULL;
		}
	}
	return c;
}